

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaParser::ExtractDataObjectFromChannel
          (ColladaParser *this,InputChannel *pInput,size_t pLocalIndex,Mesh *pMesh)

{
  pointer *ppaVar1;
  vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *this_00;
  InputType IVar2;
  size_t sVar3;
  pointer pfVar4;
  size_t sVar5;
  pointer paVar6;
  iterator __position;
  pointer paVar7;
  Logger *this_01;
  ulong uVar8;
  long lVar9;
  long lVar10;
  iterator iVar11;
  char *message;
  int iVar12;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *pvVar13;
  ulong uVar14;
  undefined8 *puVar15;
  Accessor *pAVar16;
  ai_real obj [4];
  undefined1 local_1c8 [8];
  undefined1 auStack_1c0 [24];
  pointer local_1a8;
  float local_1a0;
  
  IVar2 = pInput->mType;
  if (IVar2 == IT_Vertex) {
    return;
  }
  pAVar16 = pInput->mResolved;
  if (pAVar16->mCount <= pLocalIndex) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Invalid data index (",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,") in primitive specification",0x1c);
    std::__cxx11::stringbuf::str();
    ThrowException(this,(string *)local_1c8);
  }
  sVar3 = pAVar16->mOffset;
  pfVar4 = (pAVar16->mData->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar5 = pAVar16->mStride;
  lVar9 = 0;
  do {
    *(float *)((long)&local_1a8 + lVar9 * 4) =
         pfVar4[sVar3 + pLocalIndex * sVar5 + pAVar16->mSubOffset[lVar9]];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  switch(IVar2) {
  case IT_Position:
    if (pInput->mIndex == 0) {
      local_1c8 = (undefined1  [8])local_1a8;
      auStack_1c0._0_4_ = local_1a0;
      iVar11._M_current =
           (pMesh->mPositions).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar11._M_current !=
          (pMesh->mPositions).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        (iVar11._M_current)->z = local_1a0;
        *(pointer *)iVar11._M_current = local_1a8;
        ppaVar1 = &(pMesh->mPositions).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
        return;
      }
      pvVar13 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&pMesh->mPositions;
LAB_003fad3e:
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>(pvVar13,iVar11,(aiVector3t<float> *)local_1c8);
      return;
    }
    this_01 = DefaultLogger::get();
    message = "Collada: just one vertex position stream supported";
    break;
  case IT_Normal:
    pvVar13 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&pMesh->mNormals;
    paVar7 = (pMesh->mNormals).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(pMesh->mNormals).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish - (long)paVar7;
    uVar8 = (lVar9 >> 2) * -0x5555555555555555;
    lVar10 = ((long)(pMesh->mPositions).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pMesh->mPositions).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    if (uVar8 < lVar10 - 1U) {
      local_1c8 = (undefined1  [8])0x3f80000000000000;
      auStack_1c0._0_8_ = (ulong)(uint)auStack_1c0._4_4_ << 0x20;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::_M_fill_insert
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pvVar13,
                 (aiVector3t<float> *)((long)paVar7 + lVar9),lVar10 + ~uVar8,(value_type *)local_1c8
                );
    }
    if (pInput->mIndex == 0) {
      local_1c8 = (undefined1  [8])local_1a8;
      auStack_1c0._0_4_ = local_1a0;
      iVar11._M_current =
           (pMesh->mNormals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar11._M_current !=
          (pMesh->mNormals).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        (iVar11._M_current)->z = local_1a0;
        *(pointer *)iVar11._M_current = local_1a8;
        ppaVar1 = &(pMesh->mNormals).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
        return;
      }
      goto LAB_003fad3e;
    }
    this_01 = DefaultLogger::get();
    message = "Collada: just one vertex normal stream supported";
    break;
  case IT_Texcoord:
    uVar8 = pInput->mIndex;
    if (uVar8 < 8) {
      paVar7 = pMesh->mTexCoords[uVar8].
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar11._M_current =
           pMesh->mTexCoords[uVar8].
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      lVar10 = (long)iVar11._M_current - (long)paVar7;
      uVar14 = (lVar10 >> 2) * -0x5555555555555555;
      lVar9 = ((long)(pMesh->mPositions).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pMesh->mPositions).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      if (uVar14 < lVar9 - 1U) {
        local_1c8 = (undefined1  [8])0x0;
        auStack_1c0._0_8_ = (ulong)(uint)auStack_1c0._4_4_ << 0x20;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::_M_fill_insert
                  (pMesh->mTexCoords + uVar8,(aiVector3t<float> *)((long)paVar7 + lVar10),
                   lVar9 + ~uVar14,(value_type *)local_1c8);
        uVar8 = pInput->mIndex;
        iVar11._M_current =
             pMesh->mTexCoords[uVar8].
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      pvVar13 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                (pMesh->mTexCoords + uVar8);
      local_1c8 = (undefined1  [8])local_1a8;
      auStack_1c0._0_4_ = local_1a0;
      if (iVar11._M_current == *(aiVector3t<float> **)(pvVar13 + 0x10)) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>>(pvVar13,iVar11,(aiVector3t<float> *)local_1c8);
      }
      else {
        (iVar11._M_current)->z = local_1a0;
        *(pointer *)iVar11._M_current = local_1a8;
        *(long *)(pvVar13 + 8) = *(long *)(pvVar13 + 8) + 0xc;
      }
      if ((pAVar16->mSubOffset[2] == 0) && (pAVar16->mSubOffset[3] == 0)) {
        return;
      }
      pMesh->mNumUVComponents[pInput->mIndex] = 3;
      return;
    }
    this_01 = DefaultLogger::get();
    message = "Collada: too many texture coordinate sets. Skipping.";
    break;
  case IT_Color:
    uVar8 = pInput->mIndex;
    if (uVar8 < 8) {
      paVar6 = pMesh->mColors[uVar8].
               super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = (long)pMesh->mColors[uVar8].
                    super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
                    .super__Vector_impl_data._M_finish - (long)paVar6;
      uVar14 = lVar9 >> 4;
      lVar10 = ((long)(pMesh->mPositions).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pMesh->mPositions).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      if (uVar14 < lVar10 - 1U) {
        local_1c8 = (undefined1  [8])0x0;
        auStack_1c0._0_8_ = 0x3f80000000000000;
        std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::_M_fill_insert
                  (pMesh->mColors + uVar8,(aiColor4t<float> *)((long)paVar6 + lVar9),
                   lVar10 + ~uVar14,(value_type *)local_1c8);
        pAVar16 = pInput->mResolved;
      }
      local_1c8 = (undefined1  [8])0x0;
      auStack_1c0._0_8_ = 0x3f80000000000000;
      uVar8 = pAVar16->mSize;
      if (uVar8 != 0) {
        uVar14 = 0;
        do {
          iVar12 = (int)uVar14;
          puVar15 = (undefined8 *)((long)auStack_1c0 + 4);
          if (((iVar12 != 3) && (puVar15 = (undefined8 *)auStack_1c0, iVar12 != 2)) &&
             (puVar15 = (undefined8 *)local_1c8, iVar12 == 1)) {
            puVar15 = (undefined8 *)(local_1c8 + 4);
          }
          *(undefined4 *)puVar15 =
               *(undefined4 *)((long)&local_1a8 + pAVar16->mSubOffset[uVar14] * 4);
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar8);
      }
      this_00 = (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)
                (pMesh->mColors + pInput->mIndex);
      __position._M_current = *(aiColor4t<float> **)(this_00 + 8);
      if (__position._M_current != *(aiColor4t<float> **)(this_00 + 0x10)) {
        (__position._M_current)->r = (float)local_1c8._0_4_;
        (__position._M_current)->g = (float)local_1c8._4_4_;
        (__position._M_current)->b = (float)auStack_1c0._0_4_;
        (__position._M_current)->a = (float)auStack_1c0._4_4_;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
        return;
      }
      std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
      _M_realloc_insert<aiColor4t<float>const&>(this_00,__position,(aiColor4t<float> *)local_1c8);
      return;
    }
    this_01 = DefaultLogger::get();
    message = "Collada: too many vertex color sets. Skipping.";
    break;
  case IT_Tangent:
    pvVar13 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&pMesh->mTangents;
    paVar7 = (pMesh->mTangents).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(pMesh->mTangents).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish - (long)paVar7;
    uVar8 = (lVar9 >> 2) * -0x5555555555555555;
    lVar10 = ((long)(pMesh->mPositions).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pMesh->mPositions).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    if (uVar8 < lVar10 - 1U) {
      local_1c8 = (undefined1  [8])0x3f800000;
      auStack_1c0._0_8_ = (ulong)(uint)auStack_1c0._4_4_ << 0x20;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::_M_fill_insert
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pvVar13,
                 (aiVector3t<float> *)((long)paVar7 + lVar9),lVar10 + ~uVar8,(value_type *)local_1c8
                );
    }
    if (pInput->mIndex == 0) {
      local_1c8 = (undefined1  [8])local_1a8;
      auStack_1c0._0_4_ = local_1a0;
      iVar11._M_current =
           (pMesh->mTangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar11._M_current !=
          (pMesh->mTangents).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        (iVar11._M_current)->z = local_1a0;
        *(pointer *)iVar11._M_current = local_1a8;
        ppaVar1 = &(pMesh->mTangents).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
        return;
      }
      goto LAB_003fad3e;
    }
    this_01 = DefaultLogger::get();
    message = "Collada: just one vertex tangent stream supported";
    break;
  case IT_Bitangent:
    pvVar13 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&pMesh->mBitangents;
    paVar7 = (pMesh->mBitangents).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(pMesh->mBitangents).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish - (long)paVar7;
    uVar8 = (lVar9 >> 2) * -0x5555555555555555;
    lVar10 = ((long)(pMesh->mPositions).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pMesh->mPositions).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    if (uVar8 < lVar10 - 1U) {
      local_1c8 = (undefined1  [8])0x0;
      auStack_1c0._0_4_ = 0x3f800000;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::_M_fill_insert
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pvVar13,
                 (aiVector3t<float> *)((long)paVar7 + lVar9),lVar10 + ~uVar8,(value_type *)local_1c8
                );
    }
    if (pInput->mIndex == 0) {
      local_1c8 = (undefined1  [8])local_1a8;
      auStack_1c0._0_4_ = local_1a0;
      iVar11._M_current =
           (pMesh->mBitangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar11._M_current !=
          (pMesh->mBitangents).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        (iVar11._M_current)->z = local_1a0;
        *(pointer *)iVar11._M_current = local_1a8;
        ppaVar1 = &(pMesh->mBitangents).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
        return;
      }
      goto LAB_003fad3e;
    }
    this_01 = DefaultLogger::get();
    message = "Collada: just one vertex bitangent stream supported";
    break;
  default:
    __assert_fail("false && \"shouldn\'t ever get here\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.cpp"
                  ,0xae7,
                  "void Assimp::ColladaParser::ExtractDataObjectFromChannel(const InputChannel &, size_t, Mesh *)"
                 );
  }
  Logger::error(this_01,message);
  return;
}

Assistant:

void ColladaParser::ExtractDataObjectFromChannel(const InputChannel& pInput, size_t pLocalIndex, Mesh* pMesh)
{
    // ignore vertex referrer - we handle them that separate
    if (pInput.mType == IT_Vertex)
        return;

    const Accessor& acc = *pInput.mResolved;
    if (pLocalIndex >= acc.mCount)
        ThrowException(format() << "Invalid data index (" << pLocalIndex << "/" << acc.mCount << ") in primitive specification");

    // get a pointer to the start of the data object referred to by the accessor and the local index
    const ai_real* dataObject = &(acc.mData->mValues[0]) + acc.mOffset + pLocalIndex * acc.mStride;

    // assemble according to the accessors component sub-offset list. We don't care, yet,
    // what kind of object exactly we're extracting here
    ai_real obj[4];
    for (size_t c = 0; c < 4; ++c)
        obj[c] = dataObject[acc.mSubOffset[c]];

    // now we reinterpret it according to the type we're reading here
    switch (pInput.mType)
    {
    case IT_Position: // ignore all position streams except 0 - there can be only one position
        if (pInput.mIndex == 0)
            pMesh->mPositions.push_back(aiVector3D(obj[0], obj[1], obj[2]));
        else
            ASSIMP_LOG_ERROR("Collada: just one vertex position stream supported");
        break;
    case IT_Normal:
        // pad to current vertex count if necessary
        if (pMesh->mNormals.size() < pMesh->mPositions.size() - 1)
            pMesh->mNormals.insert(pMesh->mNormals.end(), pMesh->mPositions.size() - pMesh->mNormals.size() - 1, aiVector3D(0, 1, 0));

        // ignore all normal streams except 0 - there can be only one normal
        if (pInput.mIndex == 0)
            pMesh->mNormals.push_back(aiVector3D(obj[0], obj[1], obj[2]));
        else
            ASSIMP_LOG_ERROR("Collada: just one vertex normal stream supported");
        break;
    case IT_Tangent:
        // pad to current vertex count if necessary
        if (pMesh->mTangents.size() < pMesh->mPositions.size() - 1)
            pMesh->mTangents.insert(pMesh->mTangents.end(), pMesh->mPositions.size() - pMesh->mTangents.size() - 1, aiVector3D(1, 0, 0));

        // ignore all tangent streams except 0 - there can be only one tangent
        if (pInput.mIndex == 0)
            pMesh->mTangents.push_back(aiVector3D(obj[0], obj[1], obj[2]));
        else
            ASSIMP_LOG_ERROR("Collada: just one vertex tangent stream supported");
        break;
    case IT_Bitangent:
        // pad to current vertex count if necessary
        if (pMesh->mBitangents.size() < pMesh->mPositions.size() - 1)
            pMesh->mBitangents.insert(pMesh->mBitangents.end(), pMesh->mPositions.size() - pMesh->mBitangents.size() - 1, aiVector3D(0, 0, 1));

        // ignore all bitangent streams except 0 - there can be only one bitangent
        if (pInput.mIndex == 0)
            pMesh->mBitangents.push_back(aiVector3D(obj[0], obj[1], obj[2]));
        else
            ASSIMP_LOG_ERROR("Collada: just one vertex bitangent stream supported");
        break;
    case IT_Texcoord:
        // up to 4 texture coord sets are fine, ignore the others
        if (pInput.mIndex < AI_MAX_NUMBER_OF_TEXTURECOORDS)
        {
            // pad to current vertex count if necessary
            if (pMesh->mTexCoords[pInput.mIndex].size() < pMesh->mPositions.size() - 1)
                pMesh->mTexCoords[pInput.mIndex].insert(pMesh->mTexCoords[pInput.mIndex].end(),
                    pMesh->mPositions.size() - pMesh->mTexCoords[pInput.mIndex].size() - 1, aiVector3D(0, 0, 0));

            pMesh->mTexCoords[pInput.mIndex].push_back(aiVector3D(obj[0], obj[1], obj[2]));
            if (0 != acc.mSubOffset[2] || 0 != acc.mSubOffset[3]) /* hack ... consider cleaner solution */
                pMesh->mNumUVComponents[pInput.mIndex] = 3;
        }
        else
        {
            ASSIMP_LOG_ERROR("Collada: too many texture coordinate sets. Skipping.");
        }
        break;
    case IT_Color:
        // up to 4 color sets are fine, ignore the others
        if (pInput.mIndex < AI_MAX_NUMBER_OF_COLOR_SETS)
        {
            // pad to current vertex count if necessary
            if (pMesh->mColors[pInput.mIndex].size() < pMesh->mPositions.size() - 1)
                pMesh->mColors[pInput.mIndex].insert(pMesh->mColors[pInput.mIndex].end(),
                    pMesh->mPositions.size() - pMesh->mColors[pInput.mIndex].size() - 1, aiColor4D(0, 0, 0, 1));

            aiColor4D result(0, 0, 0, 1);
            for (size_t i = 0; i < pInput.mResolved->mSize; ++i)
            {
                result[static_cast<unsigned int>(i)] = obj[pInput.mResolved->mSubOffset[i]];
            }
            pMesh->mColors[pInput.mIndex].push_back(result);
        }
        else
        {
            ASSIMP_LOG_ERROR("Collada: too many vertex color sets. Skipping.");
        }

        break;
    default:
        // IT_Invalid and IT_Vertex
        ai_assert(false && "shouldn't ever get here");
    }
}